

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O2

SN_ELEMENT * __thiscall
ON_SerialNumberMap::Internal_HashTableFindId
          (ON_SerialNumberMap *this,ON_UUID id,ON__UINT32 id_crc32,bool bBuildTableIfNeeded)

{
  long lVar1;
  long lVar2;
  ON__UINT64 *q;
  SN_ELEMENT **ppSVar3;
  SN_ELEMENT *pSVar4;
  ulong uVar5;
  
  if (this->m_bHashTableIsValid == '\0') {
    pSVar4 = this->m_sn_block0->m_sn;
    for (uVar5 = 0; (uVar5 != 8 && (uVar5 < this->m_sn_block0->m_count)); uVar5 = uVar5 + 1) {
      lVar2._0_4_ = (pSVar4->m_id).Data1;
      lVar2._4_2_ = (pSVar4->m_id).Data2;
      lVar2._6_2_ = (pSVar4->m_id).Data3;
      if ((lVar2 == id._0_8_) &&
         ((*&(pSVar4->m_id).Data4 == id.Data4 && (pSVar4->m_id_active != '\0')))) {
        return pSVar4;
      }
      pSVar4 = pSVar4 + 1;
    }
    if (!bBuildTableIfNeeded) {
      return (SN_ELEMENT *)0x0;
    }
    Internal_HashTableBuild(this);
    if (this->m_bHashTableIsValid == '\0') {
      return (SN_ELEMENT *)0x0;
    }
  }
  ppSVar3 = (SN_ELEMENT **)
            ((ulong)(uint)((int)(((ulong)id_crc32 / 0xffa) % 0xffa) << 3) +
            (long)this->m_hash_table_blocks[(ulong)id_crc32 % (ulong)this->m_hash_block_count]);
  while( true ) {
    pSVar4 = *ppSVar3;
    if (pSVar4 == (SN_ELEMENT *)0x0) {
      return (SN_ELEMENT *)0x0;
    }
    lVar1._0_4_ = (pSVar4->m_id).Data1;
    lVar1._4_2_ = (pSVar4->m_id).Data2;
    lVar1._6_2_ = (pSVar4->m_id).Data3;
    if ((lVar1 == id._0_8_) && (*&(pSVar4->m_id).Data4 == id.Data4)) break;
    ppSVar3 = &pSVar4->m_next;
  }
  return pSVar4;
}

Assistant:

struct ON_SerialNumberMap::SN_ELEMENT* ON_SerialNumberMap::Internal_HashTableFindId(
  ON_UUID id,
  ON__UINT32 id_crc32,
  bool bBuildTableIfNeeded
  ) const
{
  // Caller checks that m_active_id_count > 0 && id != nil && id != m_inactive_id

  if (false == m_bHashTableIsValid)
  {
    for (ON__UINT32 i = 0; i < 8 && i < m_sn_block0.m_count; i++)
    {
      if ( IdIsEqual(&id,&m_sn_block0.m_sn[i].m_id) )
      {
        ON_SerialNumberMap::SN_ELEMENT* e = const_cast<ON_SerialNumberMap::SN_ELEMENT*>(&m_sn_block0.m_sn[i]);
        if ( 0 != e->m_id_active )
          return e;
      }
    }
    if ( false == bBuildTableIfNeeded )
      return nullptr;

    // expensive
    Internal_HashTableBuild();
    if ( false == m_bHashTableIsValid )
      return nullptr;
  }

  for (
    ON_SerialNumberMap::SN_ELEMENT* e = m_hash_table_blocks[id_crc32 % m_hash_block_count][(id_crc32 / ON_SN_BLOCK::ID_HASH_BLOCK_CAPACITY) % ON_SN_BLOCK::ID_HASH_BLOCK_CAPACITY];
    nullptr != e;
    e = e->m_next
    )
  {
    if ( IdIsEqual(&id,&e->m_id) )
      return e;
  }

  return nullptr;
}